

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

int mbedtls_sha1_ret(uchar *input,size_t ilen,uchar *output)

{
  int iVar1;
  undefined1 local_80 [8];
  mbedtls_sha1_context ctx;
  int ret;
  uchar *output_local;
  size_t ilen_local;
  uchar *input_local;
  
  ctx.buffer[0x38] = 0x92;
  ctx.buffer[0x39] = 0xff;
  ctx.buffer[0x3a] = 0xff;
  ctx.buffer[0x3b] = 0xff;
  unique0x10000099 = output;
  mbedtls_sha1_init((mbedtls_sha1_context *)local_80);
  ctx.buffer._56_4_ = mbedtls_sha1_starts_ret((mbedtls_sha1_context *)local_80);
  if ((ctx.buffer._56_4_ == 0) &&
     (ctx.buffer._56_4_ = mbedtls_sha1_update_ret((mbedtls_sha1_context *)local_80,input,ilen),
     ctx.buffer._56_4_ == 0)) {
    ctx.buffer._56_4_ =
         mbedtls_sha1_finish_ret((mbedtls_sha1_context *)local_80,stack0xffffffffffffffe0);
  }
  mbedtls_sha1_free((mbedtls_sha1_context *)local_80);
  iVar1._0_1_ = ctx.buffer[0x38];
  iVar1._1_1_ = ctx.buffer[0x39];
  iVar1._2_1_ = ctx.buffer[0x3a];
  iVar1._3_1_ = ctx.buffer[0x3b];
  return iVar1;
}

Assistant:

int mbedtls_sha1_ret( const unsigned char *input,
                      size_t ilen,
                      unsigned char output[20] )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_sha1_context ctx;

    SHA1_VALIDATE_RET( ilen == 0 || input != NULL );
    SHA1_VALIDATE_RET( (unsigned char *)output != NULL );

    mbedtls_sha1_init( &ctx );

    if( ( ret = mbedtls_sha1_starts_ret( &ctx ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_sha1_update_ret( &ctx, input, ilen ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_sha1_finish_ret( &ctx, output ) ) != 0 )
        goto exit;

exit:
    mbedtls_sha1_free( &ctx );

    return( ret );
}